

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.cpp
# Opt level: O0

bool __thiscall Fossilize::VulkanDevice::init_device(VulkanDevice *this,Options *opts)

{
  int iVar1;
  VkInstance pVVar2;
  VkPhysicalDevice pVVar3;
  PFN_vkEnumerateDeviceExtensionProperties p_Var4;
  PFN_vkEnumerateDeviceLayerProperties p_Var5;
  PFN_vkEnumerateInstanceExtensionProperties p_Var6;
  PFN_vkEnumerateInstanceLayerProperties p_Var7;
  PFN_vkEnumeratePhysicalDevices p_Var8;
  PFN_vkGetPhysicalDeviceProperties p_Var9;
  PFN_vkGetPhysicalDeviceQueueFamilyProperties p_Var10;
  FILE *__stream;
  undefined8 target_features;
  bool bVar11;
  bool bVar12;
  VkResult VVar13;
  uint32_t uVar14;
  uint uVar15;
  ulong uVar16;
  VkExtensionProperties *pVVar17;
  VkLayerProperties *pVVar18;
  size_type sVar19;
  reference ext_00;
  VkPhysicalDevice_T **ppVVar20;
  reference ppVVar21;
  char **ppcVar22;
  VkPhysicalDeviceRobustness2FeaturesEXT *pVVar23;
  VkPhysicalDeviceFragmentShadingRateFeaturesKHR *pVVar24;
  VkQueueFamilyProperties *pVVar25;
  reference pVVar26;
  iterator iVar27;
  iterator iVar28;
  char **local_ad8;
  char **local_ad0;
  void **local_ac8;
  VkBool32 *local_ac0;
  uint32_t local_a0c;
  VkApplicationInfo *local_9c8;
  char **local_9c0;
  uint32_t local_994;
  uint local_988;
  uint local_984;
  uint32_t i_4;
  uint32_t i_3;
  VkDeviceCreateInfo device_info;
  __normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
  local_918;
  __normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
  local_910 [2];
  char **local_900;
  char **local_8f8;
  __normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
  local_8f0;
  char *local_8e8;
  allocator<VkExtensionProperties> local_8d9;
  undefined1 local_8d8 [8];
  vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> validation_extensions;
  char *pcStack_8b8;
  uint32_t validation_ext_count;
  allocator<VkLayerProperties> local_8a9;
  undefined1 local_8a8 [8];
  vector<VkLayerProperties,_std::allocator<VkLayerProperties>_> device_layers;
  undefined1 local_888 [4];
  uint32_t device_layer_count;
  vector<const_char_*,_std::allocator<const_char_*>_> active_device_layers;
  VkQueueFamilyProperties *queue_prop;
  iterator __end1_2;
  iterator __begin1_2;
  vector<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_> *__range1_2;
  VkDeviceQueueCreateInfo queue_info;
  undefined1 local_820 [8];
  vector<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_> queue_props;
  size_type sStack_800;
  uint32_t family_count;
  size_t active_extension_count;
  VkPhysicalDeviceFragmentShadingRateFeaturesKHR local_7f0;
  undefined1 local_7d0 [24];
  undefined1 local_7b8 [8];
  anon_class_16_2_dfda6c1d begin_replacement;
  VkPhysicalDeviceFragmentShadingRateFeaturesKHR replacement_fragment_shading_rate;
  VkPhysicalDeviceRobustness2FeaturesEXT replacement_robustness2;
  VkPhysicalDeviceFeatures2 replacement_pdf2;
  VkPhysicalDeviceFeatures2 *requested_pdf2;
  VkPhysicalDeviceProperties2 gpu_props2;
  VkPhysicalDevicePipelineExecutablePropertiesFeaturesKHR stats_feature;
  VkPhysicalDeviceFeatures2 gpu_features2;
  reference pVStack_218;
  bool has_device_features2;
  reference local_210;
  VkExtensionProperties *ext_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> *__range1_1;
  undefined1 local_1e8 [8];
  vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> device_ext_props;
  undefined1 local_1c8 [4];
  uint32_t device_ext_count;
  vector<const_char_*,_std::allocator<const_char_*>_> active_device_extensions;
  uint local_1a8;
  uint32_t gpu_api_version;
  uint32_t i_2;
  vector<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_> gpus;
  undefined1 local_180 [4];
  uint32_t gpu_count;
  VkDebugReportCallbackCreateInfoEXT cb_info;
  VkExtensionProperties *ext;
  iterator __end1;
  iterator __begin1;
  vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> *__range1;
  vector<const_char_*,_std::allocator<const_char_*>_> active_exts;
  uint32_t i_1;
  uint32_t i;
  VkApplicationInfo app;
  VkInstanceCreateInfo instance_info;
  char *pcStack_98;
  bool use_debug_callback;
  allocator<VkLayerProperties> local_89;
  undefined1 local_88 [8];
  vector<VkLayerProperties,_std::allocator<VkLayerProperties>_> layers;
  undefined1 local_68 [4];
  uint32_t layer_count;
  vector<const_char_*,_std::allocator<const_char_*>_> active_layers;
  undefined1 local_48 [8];
  vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> exts;
  uint32_t local_28;
  uint32_t ext_count;
  uint32_t target_api_version;
  uint32_t instance_api_version;
  Options *opts_local;
  VulkanDevice *this_local;
  
  if ((opts->null_device & 1U) != 0) {
    init_null_device(this);
    this_local._7_1_ = 1;
    goto LAB_001dc7aa;
  }
  VVar13 = volkInitialize();
  if (VVar13 != VK_SUCCESS) {
    fprintf(_stderr,"Fossilize ERROR: volkInitialize failed.\n");
    fflush(_stderr);
    this_local._7_1_ = 0;
    goto LAB_001dc7aa;
  }
  uVar14 = volkGetInstanceVersion();
  uVar14 = major_minor_version(uVar14);
  if (uVar14 == 0) {
    fprintf(_stderr,"Fossilize ERROR: Could not find loader.\n");
    fflush(_stderr);
    this_local._7_1_ = 0;
    goto LAB_001dc7aa;
  }
  local_994 = uVar14;
  if (opts->application_info != (VkApplicationInfo *)0x0) {
    local_994 = opts->application_info->apiVersion;
  }
  local_28 = major_minor_version(local_994);
  if (uVar14 < local_28) {
    fprintf(_stderr,
            "Fossilize ERROR: Database is targeting an API version which is unsupported by this Vulkan loader.\n"
           );
    fflush(_stderr);
    this_local._7_1_ = 0;
    goto LAB_001dc7aa;
  }
  exts.super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  VVar13 = (*vkEnumerateInstanceExtensionProperties)
                     ((char *)0x0,
                      (uint32_t *)
                      ((long)&exts.
                              super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),
                      (VkExtensionProperties *)0x0);
  if (VVar13 != VK_SUCCESS) {
    this_local._7_1_ = 0;
    goto LAB_001dc7aa;
  }
  uVar16 = (ulong)exts.
                  super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
  std::allocator<VkExtensionProperties>::allocator
            ((allocator<VkExtensionProperties> *)
             ((long)&active_layers.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>::vector
            ((vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> *)local_48,
             uVar16,(allocator_type *)
                    ((long)&active_layers.
                            super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<VkExtensionProperties>::~allocator
            ((allocator<VkExtensionProperties> *)
             ((long)&active_layers.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  p_Var6 = vkEnumerateInstanceExtensionProperties;
  if (exts.super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage._4_4_ == 0) {
LAB_001dae77:
    std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_68);
    if ((opts->enable_validation & 1U) == 0) {
LAB_001dafbc:
      bVar11 = find_extension((vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                               *)local_48,"VK_EXT_debug_report");
      memset(&app.engineVersion,0,0x40);
      app.engineVersion = 1;
      memset(&i_1,0,0x30);
      app.pNext = anon_var_dwarf_126460;
      app._24_8_ = anon_var_dwarf_126476;
      app.pEngineName._4_4_ = uVar14;
      sVar19 = std::vector<const_char_*,_std::allocator<const_char_*>_>::size
                         ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_68);
      bVar12 = std::vector<const_char_*,_std::allocator<const_char_*>_>::empty
                         ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_68);
      if (bVar12) {
        local_9c0 = (char **)0x0;
      }
      else {
        local_9c0 = std::vector<const_char_*,_std::allocator<const_char_*>_>::data
                              ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_68);
      }
      if (opts->application_info == (VkApplicationInfo *)0x0) {
        local_9c8 = (VkApplicationInfo *)&i_1;
      }
      else {
        local_9c8 = opts->application_info;
      }
      for (active_exts.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
          active_exts.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ < (uint)sVar19;
          active_exts.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ =
               active_exts.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
        fprintf(_stderr,"Fossilize INFO: Enabling instance layer: %s\n",
                local_9c0[active_exts.
                          super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage._4_4_]);
        fflush(_stderr);
      }
      for (active_exts.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
          (uint)active_exts.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage < (uint)instance_info.ppEnabledLayerNames;
          active_exts.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._0_4_ =
               (uint)active_exts.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 1) {
        fprintf(_stderr,"Fossilize INFO: Enabling instance extension: %s\n",
                *(undefined8 *)
                 (instance_info._48_8_ +
                 (ulong)(uint)active_exts.
                              super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage * 8));
        fflush(_stderr);
      }
      std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
                ((vector<const_char_*,_std::allocator<const_char_*>_> *)&__range1);
      __end1 = std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>::begin
                         ((vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> *)
                          local_48);
      ext = (VkExtensionProperties *)
            std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>::end
                      ((vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> *)
                       local_48);
      while (bVar12 = __gnu_cxx::operator!=
                                (&__end1,(__normal_iterator<VkExtensionProperties_*,_std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>_>
                                          *)&ext), bVar12) {
        ext_00 = __gnu_cxx::
                 __normal_iterator<VkExtensionProperties_*,_std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>_>
                 ::operator*(&__end1);
        bVar12 = filter_instance_extension(ext_00->extensionName,local_9c8->apiVersion);
        if (bVar12) {
          cb_info.pUserData = ext_00;
          std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
                    ((vector<const_char_*,_std::allocator<const_char_*>_> *)&__range1,
                     (value_type *)&cb_info.pUserData);
        }
        __gnu_cxx::
        __normal_iterator<VkExtensionProperties_*,_std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>_>
        ::operator++(&__end1);
      }
      std::vector<const_char_*,_std::allocator<const_char_*>_>::size
                ((vector<const_char_*,_std::allocator<const_char_*>_> *)&__range1);
      bVar12 = std::vector<const_char_*,_std::allocator<const_char_*>_>::empty
                         ((vector<const_char_*,_std::allocator<const_char_*>_> *)&__range1);
      if (!bVar12) {
        std::vector<const_char_*,_std::allocator<const_char_*>_>::data
                  ((vector<const_char_*,_std::allocator<const_char_*>_> *)&__range1);
      }
      VVar13 = (*vkCreateInstance)((VkInstanceCreateInfo *)&app.engineVersion,
                                   (VkAllocationCallbacks *)0x0,&this->instance);
      if (VVar13 == VK_SUCCESS) {
        volkLoadInstance(this->instance);
        if (bVar11) {
          memset(local_180,0,0x28);
          local_180 = (undefined1  [4])0x3b9af4f8;
          cb_info._16_8_ = debug_callback;
          cb_info.pNext._0_4_ = 8;
          cb_info.pfnCallback = (PFN_vkDebugReportCallbackEXT)this;
          VVar13 = (*vkCreateDebugReportCallbackEXT)
                             (this->instance,(VkDebugReportCallbackCreateInfoEXT *)local_180,
                              (VkAllocationCallbacks *)0x0,&this->callback);
          if (VVar13 != VK_SUCCESS) {
            this_local._7_1_ = 0;
            active_layers.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
            goto LAB_001dc78c;
          }
        }
        gpus.super__Vector_base<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
        VVar13 = (*vkEnumeratePhysicalDevices)
                           (this->instance,
                            (uint32_t *)
                            ((long)&gpus.
                                    super__Vector_base<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),
                            (VkPhysicalDevice *)0x0);
        if (VVar13 == VK_SUCCESS) {
          uVar16 = (ulong)gpus.
                          super__Vector_base<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
          std::allocator<VkPhysicalDevice_T_*>::allocator
                    ((allocator<VkPhysicalDevice_T_*> *)((long)&gpu_api_version + 3));
          std::vector<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>::vector
                    ((vector<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_> *)&i_2,
                     uVar16,(allocator_type *)((long)&gpu_api_version + 3));
          std::allocator<VkPhysicalDevice_T_*>::~allocator
                    ((allocator<VkPhysicalDevice_T_*> *)((long)&gpu_api_version + 3));
          p_Var8 = vkEnumeratePhysicalDevices;
          if (gpus.super__Vector_base<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == 0) {
            fprintf(_stderr,"Fossilize ERROR: No physical devices.\n");
            fflush(_stderr);
            this_local._7_1_ = 0;
            active_layers.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
          }
          else {
            pVVar2 = this->instance;
            ppVVar20 = std::vector<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>::
                       data((vector<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_> *)
                            &i_2);
            VVar13 = (*p_Var8)(pVVar2,(uint32_t *)
                                      ((long)&gpus.
                                              super__Vector_base<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage + 4
                                      ),ppVVar20);
            if (VVar13 == VK_SUCCESS) {
              for (local_1a8 = 0; p_Var9 = vkGetPhysicalDeviceProperties,
                  local_1a8 <
                  gpus.
                  super__Vector_base<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_; local_1a8 = local_1a8 + 1
                  ) {
                ppVVar21 = std::vector<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>
                           ::operator[]((vector<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>
                                         *)&i_2,(ulong)local_1a8);
                (*p_Var9)(*ppVVar21,&this->gpu_props);
                fprintf(_stderr,"Fossilize INFO: Enumerated GPU #%u:\n",(ulong)local_1a8);
                fflush(_stderr);
                fprintf(_stderr,"Fossilize INFO:   name: %s\n",(this->gpu_props).deviceName);
                fflush(_stderr);
                fprintf(_stderr,"Fossilize INFO:   apiVersion: %u.%u.%u\n",
                        (ulong)((this->gpu_props).apiVersion >> 0x16),
                        (ulong)((this->gpu_props).apiVersion >> 0xc & 0x3ff),
                        (ulong)((this->gpu_props).apiVersion & 0xfff));
                fflush(_stderr);
              }
              if (opts->device_index < 0) {
                ppVVar21 = std::vector<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>
                           ::front((vector<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>
                                    *)&i_2);
                this->gpu = *ppVVar21;
              }
              else {
                iVar1 = opts->device_index;
                sVar19 = std::vector<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>::
                         size((vector<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_> *
                              )&i_2);
                __stream = _stderr;
                if (sVar19 <= (ulong)(long)iVar1) {
                  uVar15 = opts->device_index;
                  sVar19 = std::vector<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>
                           ::size((vector<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>
                                   *)&i_2);
                  fprintf(__stream,
                          "Fossilize ERROR: Device index %d is out of range, only %u devices on system.\n"
                          ,(ulong)uVar15,sVar19 & 0xffffffff);
                  fflush(_stderr);
                  this_local._7_1_ = 0;
                  active_layers.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
                  goto LAB_001dc780;
                }
                ppVVar21 = std::vector<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>
                           ::operator[]((vector<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>
                                         *)&i_2,(long)opts->device_index);
                this->gpu = *ppVVar21;
              }
              (*vkGetPhysicalDeviceProperties)(this->gpu,&this->gpu_props);
              fprintf(_stderr,"Fossilize INFO: Chose GPU:\n");
              fflush(_stderr);
              fprintf(_stderr,"Fossilize INFO:   name: %s\n",(this->gpu_props).deviceName);
              fflush(_stderr);
              fprintf(_stderr,"Fossilize INFO:   apiVersion: %u.%u.%u\n",
                      (ulong)((this->gpu_props).apiVersion >> 0x16),
                      (ulong)((this->gpu_props).apiVersion >> 0xc & 0x3ff),
                      (ulong)((this->gpu_props).apiVersion & 0xfff));
              fflush(_stderr);
              fprintf(_stderr,"Fossilize INFO:   vendorID: 0x%x\n",(ulong)(this->gpu_props).vendorID
                     );
              fflush(_stderr);
              fprintf(_stderr,"Fossilize INFO:   deviceID: 0x%x\n",(ulong)(this->gpu_props).deviceID
                     );
              fflush(_stderr);
              active_device_extensions.
              super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage._4_4_ =
                   major_minor_version((this->gpu_props).apiVersion);
              if (opts->application_info == (VkApplicationInfo *)0x0) {
                local_a0c = active_device_extensions.
                            super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage._4_4_;
                if (uVar14 < active_device_extensions.
                             super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl
                             .super__Vector_impl_data._M_end_of_storage._4_4_) {
                  local_a0c = uVar14;
                }
                local_28 = local_a0c;
              }
              if (active_device_extensions.
                  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage._4_4_ < local_28) {
                fprintf(_stderr,
                        "Fossilize ERROR: Selected GPU does not support desired Vulkan API version.\n"
                       );
                fflush(_stderr);
                this_local._7_1_ = 0;
                active_layers.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
              }
              else {
                this->api_version = local_28;
                std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
                          ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_1c8);
                device_ext_props.
                super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
                VVar13 = (*vkEnumerateDeviceExtensionProperties)
                                   (this->gpu,(char *)0x0,
                                    (uint32_t *)
                                    ((long)&device_ext_props.
                                            super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),
                                    (VkExtensionProperties *)0x0);
                if (VVar13 == VK_SUCCESS) {
                  uVar16 = (ulong)device_ext_props.
                                  super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
                  std::allocator<VkExtensionProperties>::allocator
                            ((allocator<VkExtensionProperties> *)((long)&__range1_1 + 7));
                  std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>::vector
                            ((vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                              *)local_1e8,uVar16,(allocator_type *)((long)&__range1_1 + 7));
                  std::allocator<VkExtensionProperties>::~allocator
                            ((allocator<VkExtensionProperties> *)((long)&__range1_1 + 7));
                  p_Var4 = vkEnumerateDeviceExtensionProperties;
                  if (device_ext_props.
                      super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == 0) {
LAB_001db971:
                    __end1_1 = std::
                               vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                               ::begin((vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                                        *)local_1e8);
                    ext_1 = (VkExtensionProperties *)
                            std::
                            vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>::
                            end((vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                                 *)local_1e8);
                    while (bVar11 = __gnu_cxx::operator!=
                                              (&__end1_1,
                                               (__normal_iterator<VkExtensionProperties_*,_std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>_>
                                                *)&ext_1), bVar11) {
                      local_210 = __gnu_cxx::
                                  __normal_iterator<VkExtensionProperties_*,_std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>_>
                                  ::operator*(&__end1_1);
                      bVar11 = filter_extension(local_210->extensionName,
                                                (bool)(opts->want_amd_shader_info & 1),
                                                (vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                                                 *)local_1e8,this->api_version);
                      if (bVar11) {
                        pVStack_218 = local_210;
                        std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
                                  ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_1c8,
                                   (value_type *)&stack0xfffffffffffffde8);
                      }
                      __gnu_cxx::
                      __normal_iterator<VkExtensionProperties_*,_std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>_>
                      ::operator++(&__end1_1);
                    }
                    gpu_features2._239_1_ =
                         find_extension((vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                                         *)local_48,"VK_KHR_get_physical_device_properties2");
                    memset(&stats_feature.pipelineExecutableInfo,0,0xf0);
                    stats_feature.pipelineExecutableInfo = 0x3b9bb078;
                    gpu_props2.properties.sparseProperties.residencyNonResidentStrict = 0x3b9ee4c8;
                    gpu_props2.properties._820_4_ = 0;
                    stats_feature.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
                    stats_feature._4_4_ = 0;
                    stats_feature.pNext = (void *)0x0;
                    gpu_features2._0_8_ =
                         &gpu_props2.properties.sparseProperties.residencyNonResidentStrict;
                    if ((gpu_features2._239_1_ & 1) == 0) {
                      (*vkGetPhysicalDeviceFeatures)
                                (this->gpu,(VkPhysicalDeviceFeatures *)&gpu_features2.pNext);
                    }
                    else {
                      uVar14 = this->api_version;
                      ppcVar22 = std::vector<const_char_*,_std::allocator<const_char_*>_>::data
                                           ((vector<const_char_*,_std::allocator<const_char_*>_> *)
                                            local_1c8);
                      sVar19 = std::vector<const_char_*,_std::allocator<const_char_*>_>::size
                                         ((vector<const_char_*,_std::allocator<const_char_*>_> *)
                                          local_1c8);
                      stats_feature._0_8_ =
                           build_pnext_chain(&this->features,uVar14,ppcVar22,(uint32_t)sVar19);
                      (*vkGetPhysicalDeviceFeatures2KHR)
                                (this->gpu,
                                 (VkPhysicalDeviceFeatures2 *)&stats_feature.pipelineExecutableInfo)
                      ;
                      this->pipeline_stats = (int)stats_feature.pNext != 0;
                      if (((this->pipeline_stats & 1U) == 0) ||
                         ((opts->want_pipeline_stats & 1U) == 0)) {
                        stats_feature.pNext = (void *)((ulong)stats_feature.pNext._4_4_ << 0x20);
                      }
                      else {
                        stats_feature.pNext = (void *)CONCAT44(stats_feature.pNext._4_4_,1);
                      }
                    }
                    memset(&requested_pdf2,0,0x348);
                    requested_pdf2._0_4_ = 0x3b9bb079;
                    if ((gpu_features2._239_1_ & 1) == 0) {
                      (*vkGetPhysicalDeviceProperties)
                                (this->gpu,(VkPhysicalDeviceProperties *)&gpu_props2.pNext);
                    }
                    else {
                      uVar14 = this->api_version;
                      ppcVar22 = std::vector<const_char_*,_std::allocator<const_char_*>_>::data
                                           ((vector<const_char_*,_std::allocator<const_char_*>_> *)
                                            local_1c8);
                      sVar19 = std::vector<const_char_*,_std::allocator<const_char_*>_>::size
                                         ((vector<const_char_*,_std::allocator<const_char_*>_> *)
                                          local_1c8);
                      gpu_props2._0_8_ =
                           build_pnext_chain(&this->props,uVar14,ppcVar22,(uint32_t)sVar19);
                      (*vkGetPhysicalDeviceProperties2KHR)
                                (this->gpu,(VkPhysicalDeviceProperties2 *)&requested_pdf2);
                    }
                    replacement_pdf2._232_8_ = opts->features;
                    local_7b8 = (undefined1  [8])&replacement_robustness2.nullDescriptor;
                    begin_replacement.replacement_pdf2 =
                         (VkPhysicalDeviceFeatures2 *)&replacement_pdf2.features.inheritedQueries;
                    if (opts->features != (VkPhysicalDeviceFeatures2 *)0x0) {
                      bVar11 = application_info_promote_robustness2(opts->application_info);
                      if ((bVar11) &&
                         (pVVar23 = find_pnext<VkPhysicalDeviceRobustness2FeaturesEXT>
                                              (VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_ROBUSTNESS_2_FEATURES_EXT
                                               ,opts->features->pNext),
                         pVVar23 == (VkPhysicalDeviceRobustness2FeaturesEXT *)0x0)) {
                        memset(&local_7f0.attachmentFragmentShadingRate,0,0x20);
                        local_7f0.attachmentFragmentShadingRate = 0x3b9f2730;
                        replacement_fragment_shading_rate._28_4_ = local_7f0._28_4_;
                        replacement_fragment_shading_rate.attachmentFragmentShadingRate = 0x3b9f2730
                        ;
                        replacement_robustness2._0_8_ = local_7d0._0_8_;
                        replacement_robustness2.pNext = (void *)local_7d0._8_8_;
                        replacement_robustness2.robustBufferAccess2 = local_7d0._16_4_;
                        replacement_robustness2.robustImageAccess2 = local_7d0._20_4_;
                        init_device::anon_class_16_2_dfda6c1d::operator()
                                  ((anon_class_16_2_dfda6c1d *)local_7b8,
                                   &replacement_fragment_shading_rate.attachmentFragmentShadingRate)
                        ;
                        replacement_robustness2.pNext =
                             (void *)CONCAT44((opts->features->features).robustBufferAccess,
                                              (opts->features->features).robustBufferAccess);
                        replacement_robustness2.robustBufferAccess2 = 1;
                      }
                      bVar11 = application_info_promote_fragment_shading_rate
                                         (opts->application_info);
                      if ((bVar11) &&
                         (pVVar24 = find_pnext<VkPhysicalDeviceFragmentShadingRateFeaturesKHR>
                                              (VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FRAGMENT_SHADING_RATE_FEATURES_KHR
                                               ,opts->features->pNext),
                         pVVar24 == (VkPhysicalDeviceFragmentShadingRateFeaturesKHR *)0x0)) {
                        memset(&active_extension_count,0,0x20);
                        active_extension_count._0_4_ = 0x3b9e3cd3;
                        begin_replacement.requested_pdf2 =
                             (VkPhysicalDeviceFeatures2 **)
                             CONCAT44(active_extension_count._4_4_,0x3b9e3cd3);
                        replacement_fragment_shading_rate.sType = local_7f0.sType;
                        replacement_fragment_shading_rate._4_4_ = local_7f0._4_4_;
                        replacement_fragment_shading_rate.pNext = local_7f0.pNext;
                        replacement_fragment_shading_rate.pipelineFragmentShadingRate =
                             local_7f0.pipelineFragmentShadingRate;
                        replacement_fragment_shading_rate.primitiveFragmentShadingRate =
                             local_7f0.primitiveFragmentShadingRate;
                        init_device::anon_class_16_2_dfda6c1d::operator()
                                  ((anon_class_16_2_dfda6c1d *)local_7b8,
                                   &begin_replacement.requested_pdf2);
                        reset_features((VkPhysicalDeviceFragmentShadingRateFeaturesKHR *)
                                       &begin_replacement.requested_pdf2,1);
                      }
                    }
                    sStack_800 = std::vector<const_char_*,_std::allocator<const_char_*>_>::size
                                           ((vector<const_char_*,_std::allocator<const_char_*>_> *)
                                            local_1c8);
                    target_features = replacement_pdf2._232_8_;
                    ppcVar22 = std::vector<const_char_*,_std::allocator<const_char_*>_>::data
                                         ((vector<const_char_*,_std::allocator<const_char_*>_> *)
                                          local_1c8);
                    filter_feature_enablement
                              ((VkPhysicalDeviceFeatures2 *)&stats_feature.pipelineExecutableInfo,
                               &this->features,(VkPhysicalDeviceFeatures2 *)target_features,ppcVar22
                               ,&stack0xfffffffffffff800);
                    std::vector<const_char_*,_std::allocator<const_char_*>_>::resize
                              ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_1c8,
                               sStack_800);
                    queue_props.
                    super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
                    (*vkGetPhysicalDeviceQueueFamilyProperties)
                              (this->gpu,
                               (uint32_t *)
                               ((long)&queue_props.
                                       super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),
                               (VkQueueFamilyProperties *)0x0);
                    uVar16 = (ulong)queue_props.
                                    super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
                    std::allocator<VkQueueFamilyProperties>::allocator
                              ((allocator<VkQueueFamilyProperties> *)
                               ((long)&queue_info.pQueuePriorities + 7));
                    std::vector<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>::
                    vector((vector<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                            *)local_820,uVar16,
                           (allocator_type *)((long)&queue_info.pQueuePriorities + 7));
                    std::allocator<VkQueueFamilyProperties>::~allocator
                              ((allocator<VkQueueFamilyProperties> *)
                               ((long)&queue_info.pQueuePriorities + 7));
                    p_Var10 = vkGetPhysicalDeviceQueueFamilyProperties;
                    pVVar3 = this->gpu;
                    pVVar25 = std::
                              vector<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                              ::data((vector<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                                      *)local_820);
                    (*p_Var10)(pVVar3,(uint32_t *)
                                      ((long)&queue_props.
                                              super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage + 4
                                      ),pVVar25);
                    memset(&__range1_2,0,0x28);
                    __range1_2._0_4_ = 2;
                    queue_info._24_8_ = &init_device::one;
                    queue_info.flags = 1;
                    __end1_2 = std::
                               vector<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                               ::begin((vector<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                                        *)local_820);
                    queue_prop = (VkQueueFamilyProperties *)
                                 std::
                                 vector<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                                 ::end((vector<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                                        *)local_820);
                    while (bVar11 = __gnu_cxx::operator!=
                                              (&__end1_2,
                                               (__normal_iterator<VkQueueFamilyProperties_*,_std::vector<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>_>
                                                *)&queue_prop), bVar11) {
                      pVVar26 = __gnu_cxx::
                                __normal_iterator<VkQueueFamilyProperties_*,_std::vector<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>_>
                                ::operator*(&__end1_2);
                      active_device_layers.
                      super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage = (pointer)pVVar26;
                      if ((pVVar26->queueCount != 0) && ((pVVar26->queueFlags & 1) != 0)) {
                        pVVar25 = std::
                                  vector<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                                  ::data((vector<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                                          *)local_820);
                        queue_info.pNext._4_4_ =
                             (undefined4)(((long)pVVar26 - (long)pVVar25) / 0x18);
                        break;
                      }
                      __gnu_cxx::
                      __normal_iterator<VkQueueFamilyProperties_*,_std::vector<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>_>
                      ::operator++(&__end1_2);
                    }
                    std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
                              ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_888);
                    if ((opts->enable_validation & 1U) == 0) {
LAB_001dc2ff:
                      local_8f8 = (char **)std::
                                           begin<std::vector<char_const*,std::allocator<char_const*>>>
                                                     ((
                                                  vector<const_char_*,_std::allocator<const_char_*>_>
                                                  *)local_1c8);
                      local_900 = (char **)std::
                                           end<std::vector<char_const*,std::allocator<char_const*>>>
                                                     ((
                                                  vector<const_char_*,_std::allocator<const_char_*>_>
                                                  *)local_1c8);
                      local_8f0 = std::
                                  find_if<__gnu_cxx::__normal_iterator<char_const**,std::vector<char_const*,std::allocator<char_const*>>>,Fossilize::VulkanDevice::init_device(Fossilize::VulkanDevice::Options_const&)::__1>
                                            (local_8f8,local_900);
                      local_910[0]._M_current =
                           (char **)std::end<std::vector<char_const*,std::allocator<char_const*>>>
                                              ((vector<const_char_*,_std::allocator<const_char_*>_>
                                                *)local_1c8);
                      bVar11 = __gnu_cxx::operator!=(&local_8f0,local_910);
                      this->supports_pipeline_feedback = bVar11;
                      iVar27 = std::begin<std::vector<char_const*,std::allocator<char_const*>>>
                                         ((vector<const_char_*,_std::allocator<const_char_*>_> *)
                                          local_1c8);
                      iVar28 = std::end<std::vector<char_const*,std::allocator<char_const*>>>
                                         ((vector<const_char_*,_std::allocator<const_char_*>_> *)
                                          local_1c8);
                      local_918 = std::
                                  find_if<__gnu_cxx::__normal_iterator<char_const**,std::vector<char_const*,std::allocator<char_const*>>>,Fossilize::VulkanDevice::init_device(Fossilize::VulkanDevice::Options_const&)::__2>
                                            (iVar27._M_current,iVar28._M_current);
                      device_info.pEnabledFeatures =
                           (VkPhysicalDeviceFeatures *)
                           std::end<std::vector<char_const*,std::allocator<char_const*>>>
                                     ((vector<const_char_*,_std::allocator<const_char_*>_> *)
                                      local_1c8);
                      bVar11 = __gnu_cxx::operator!=
                                         (&local_918,
                                          (__normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
                                           *)&device_info.pEnabledFeatures);
                      this->amd_shader_info = bVar11;
                      this->supports_module_identifiers =
                           (this->features).shader_module_identifier.shaderModuleIdentifier == 1;
                      memset(&i_4,0,0x48);
                      i_4 = 3;
                      if ((gpu_features2._239_1_ & 1) == 0) {
                        local_ac0 = (VkBool32 *)0x0;
                      }
                      else {
                        local_ac0 = &stats_feature.pipelineExecutableInfo;
                      }
                      device_info._0_8_ = local_ac0;
                      if ((gpu_features2._239_1_ & 1) == 0) {
                        local_ac8 = &gpu_features2.pNext;
                      }
                      else {
                        local_ac8 = (void **)0x0;
                      }
                      device_info.ppEnabledExtensionNames = (char **)local_ac8;
                      device_info._16_8_ = &__range1_2;
                      device_info.pNext._4_4_ = 1;
                      sVar19 = std::vector<const_char_*,_std::allocator<const_char_*>_>::size
                                         ((vector<const_char_*,_std::allocator<const_char_*>_> *)
                                          local_888);
                      device_info.pQueueCreateInfos._0_4_ = (uint)sVar19;
                      bVar11 = std::vector<const_char_*,_std::allocator<const_char_*>_>::empty
                                         ((vector<const_char_*,_std::allocator<const_char_*>_> *)
                                          local_888);
                      if (bVar11) {
                        local_ad0 = (char **)0x0;
                      }
                      else {
                        local_ad0 = std::vector<const_char_*,_std::allocator<const_char_*>_>::data
                                              ((vector<const_char_*,_std::allocator<const_char_*>_>
                                                *)local_888);
                      }
                      device_info._32_8_ = local_ad0;
                      sVar19 = std::vector<const_char_*,_std::allocator<const_char_*>_>::size
                                         ((vector<const_char_*,_std::allocator<const_char_*>_> *)
                                          local_1c8);
                      device_info.ppEnabledLayerNames._0_4_ = (uint)sVar19;
                      bVar11 = std::vector<const_char_*,_std::allocator<const_char_*>_>::empty
                                         ((vector<const_char_*,_std::allocator<const_char_*>_> *)
                                          local_1c8);
                      if (bVar11) {
                        local_ad8 = (char **)0x0;
                      }
                      else {
                        local_ad8 = std::vector<const_char_*,_std::allocator<const_char_*>_>::data
                                              ((vector<const_char_*,_std::allocator<const_char_*>_>
                                                *)local_1c8);
                      }
                      device_info._48_8_ = local_ad8;
                      if (device_info._32_8_ != 0) {
                        for (local_984 = 0; local_984 < (uint)device_info.pQueueCreateInfos;
                            local_984 = local_984 + 1) {
                          fprintf(_stderr,"Fossilize INFO: Enabling device layer: %s\n",
                                  *(undefined8 *)(device_info._32_8_ + (ulong)local_984 * 8));
                          fflush(_stderr);
                        }
                      }
                      if (device_info._48_8_ != 0) {
                        for (local_988 = 0; local_988 < (uint)device_info.ppEnabledLayerNames;
                            local_988 = local_988 + 1) {
                          fprintf(_stderr,"Fossilize INFO: Enabling device extension: %s\n",
                                  *(undefined8 *)(device_info._48_8_ + (ulong)local_988 * 8));
                          fflush(_stderr);
                        }
                      }
                      VVar13 = (*vkCreateDevice)(this->gpu,(VkDeviceCreateInfo *)&i_4,
                                                 (VkAllocationCallbacks *)0x0,&this->device);
                      if (VVar13 == VK_SUCCESS) {
                        uVar15 = this->api_version;
                        std::vector<const_char_*,_std::allocator<const_char_*>_>::data
                                  ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_1c8)
                        ;
                        std::vector<const_char_*,_std::allocator<const_char_*>_>::size
                                  ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_1c8)
                        ;
                        uVar15 = FeatureFilter::init(&this->feature_filter,
                                                     (EVP_PKEY_CTX *)(ulong)uVar15);
                        if ((uVar15 & 1) == 0) {
                          fprintf(_stderr,"Fossilize ERROR: Failed to init feature filter.\n");
                          fflush(_stderr);
                          this_local._7_1_ = 0;
                          active_layers.
                          super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
                        }
                        else {
                          FeatureFilter::set_device_query_interface
                                    (&this->feature_filter,&this->super_DeviceQueryInterface);
                          this_local._7_1_ = 1;
                          active_layers.
                          super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
                        }
                      }
                      else {
                        fprintf(_stderr,"Fossilize ERROR: Failed to create device.\n");
                        fflush(_stderr);
                        this_local._7_1_ = 0;
                        active_layers.
                        super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
                      }
                    }
                    else {
                      device_layers.
                      super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
                      VVar13 = (*vkEnumerateDeviceLayerProperties)
                                         (this->gpu,
                                          (uint32_t *)
                                          ((long)&device_layers.
                                                  super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                          + 4),(VkLayerProperties *)0x0);
                      if (VVar13 == VK_SUCCESS) {
                        uVar16 = (ulong)device_layers.
                                        super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
                        std::allocator<VkLayerProperties>::allocator(&local_8a9);
                        std::vector<VkLayerProperties,_std::allocator<VkLayerProperties>_>::vector
                                  ((vector<VkLayerProperties,_std::allocator<VkLayerProperties>_> *)
                                   local_8a8,uVar16,&local_8a9);
                        std::allocator<VkLayerProperties>::~allocator(&local_8a9);
                        p_Var5 = vkEnumerateDeviceLayerProperties;
                        if (device_layers.
                            super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == 0) {
LAB_001dc14b:
                          bVar11 = find_layer((vector<VkLayerProperties,_std::allocator<VkLayerProperties>_>
                                               *)local_8a8,"VK_LAYER_KHRONOS_validation");
                          if (bVar11) {
                            pcStack_8b8 = "VK_LAYER_KHRONOS_validation";
                            std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
                                      ((vector<const_char_*,_std::allocator<const_char_*>_> *)
                                       local_888,&stack0xfffffffffffff748);
                            validation_extensions.
                            super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
                            (*vkEnumerateDeviceExtensionProperties)
                                      (this->gpu,"VK_LAYER_KHRONOS_validation",
                                       (uint32_t *)
                                       ((long)&validation_extensions.
                                               super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                                               ._M_impl.super__Vector_impl_data._M_end_of_storage +
                                       4),(VkExtensionProperties *)0x0);
                            uVar16 = (ulong)validation_extensions.
                                            super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_
                            ;
                            std::allocator<VkExtensionProperties>::allocator(&local_8d9);
                            std::
                            vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>::
                            vector((vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                                    *)local_8d8,uVar16,&local_8d9);
                            std::allocator<VkExtensionProperties>::~allocator(&local_8d9);
                            p_Var4 = vkEnumerateDeviceExtensionProperties;
                            pVVar3 = this->gpu;
                            pVVar17 = std::
                                      vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                                      ::data((vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                                              *)local_8d8);
                            (*p_Var4)(pVVar3,"VK_LAYER_KHRONOS_validation",
                                      (uint32_t *)
                                      ((long)&validation_extensions.
                                              super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage + 4
                                      ),pVVar17);
                            bVar11 = find_extension((
                                                  vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                                                  *)local_8d8,"VK_EXT_validation_cache");
                            this->validation_cache = bVar11;
                            if ((this->validation_cache & 1U) != 0) {
                              local_8e8 = "VK_EXT_validation_cache";
                              std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
                                        ((vector<const_char_*,_std::allocator<const_char_*>_> *)
                                         local_1c8,&local_8e8);
                            }
                            std::
                            vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>::
                            ~vector((vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                                     *)local_8d8);
                            active_layers.
                            super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
                          }
                          else {
                            fprintf(_stderr,
                                    "Fossilize ERROR: Cannot find VK_LAYER_KHRONOS_validation layer.\n"
                                   );
                            fflush(_stderr);
                            this_local._7_1_ = 0;
                            active_layers.
                            super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
                          }
                        }
                        else {
                          pVVar3 = this->gpu;
                          pVVar18 = std::
                                    vector<VkLayerProperties,_std::allocator<VkLayerProperties>_>::
                                    data((vector<VkLayerProperties,_std::allocator<VkLayerProperties>_>
                                          *)local_8a8);
                          VVar13 = (*p_Var5)(pVVar3,(uint32_t *)
                                                    ((long)&device_layers.
                                                                                                                        
                                                  super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  + 4),pVVar18);
                          if (VVar13 == VK_SUCCESS) goto LAB_001dc14b;
                          this_local._7_1_ = 0;
                          active_layers.
                          super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
                        }
                        std::vector<VkLayerProperties,_std::allocator<VkLayerProperties>_>::~vector
                                  ((vector<VkLayerProperties,_std::allocator<VkLayerProperties>_> *)
                                   local_8a8);
                        if ((int)active_layers.
                                 super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage == 0)
                        goto LAB_001dc2ff;
                      }
                      else {
                        this_local._7_1_ = 0;
                        active_layers.
                        super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
                      }
                    }
                    std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector
                              ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_888);
                    std::vector<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>::
                    ~vector((vector<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                             *)local_820);
                  }
                  else {
                    pVVar3 = this->gpu;
                    pVVar17 = std::
                              vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                              ::data((vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                                      *)local_1e8);
                    VVar13 = (*p_Var4)(pVVar3,(char *)0x0,
                                       (uint32_t *)
                                       ((long)&device_ext_props.
                                               super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                                               ._M_impl.super__Vector_impl_data._M_end_of_storage +
                                       4),pVVar17);
                    if (VVar13 == VK_SUCCESS) goto LAB_001db971;
                    this_local._7_1_ = 0;
                    active_layers.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
                  }
                  std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>::
                  ~vector((vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> *)
                          local_1e8);
                }
                else {
                  this_local._7_1_ = 0;
                  active_layers.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
                }
                std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector
                          ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_1c8);
              }
            }
            else {
              this_local._7_1_ = 0;
              active_layers.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
            }
          }
LAB_001dc780:
          std::vector<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>::~vector
                    ((vector<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_> *)&i_2);
        }
        else {
          this_local._7_1_ = 0;
          active_layers.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
        }
      }
      else {
        fprintf(_stderr,"Fossilize ERROR: Failed to create instance.\n");
        fflush(_stderr);
        this_local._7_1_ = 0;
        active_layers.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
      }
LAB_001dc78c:
      std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector
                ((vector<const_char_*,_std::allocator<const_char_*>_> *)&__range1);
    }
    else {
      layers.super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      VVar13 = (*vkEnumerateInstanceLayerProperties)
                         ((uint32_t *)
                          ((long)&layers.
                                  super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),
                          (VkLayerProperties *)0x0);
      if (VVar13 == VK_SUCCESS) {
        uVar16 = (ulong)layers.
                        super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
        std::allocator<VkLayerProperties>::allocator(&local_89);
        std::vector<VkLayerProperties,_std::allocator<VkLayerProperties>_>::vector
                  ((vector<VkLayerProperties,_std::allocator<VkLayerProperties>_> *)local_88,uVar16,
                   &local_89);
        std::allocator<VkLayerProperties>::~allocator(&local_89);
        p_Var7 = vkEnumerateInstanceLayerProperties;
        pVVar18 = std::vector<VkLayerProperties,_std::allocator<VkLayerProperties>_>::data
                            ((vector<VkLayerProperties,_std::allocator<VkLayerProperties>_> *)
                             local_88);
        VVar13 = (*p_Var7)((uint32_t *)
                           ((long)&layers.
                                   super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),pVVar18);
        if (VVar13 == VK_SUCCESS) {
          bVar11 = find_layer((vector<VkLayerProperties,_std::allocator<VkLayerProperties>_> *)
                              local_88,"VK_LAYER_KHRONOS_validation");
          if (bVar11) {
            pcStack_98 = "VK_LAYER_KHRONOS_validation";
            std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
                      ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_68,
                       &stack0xffffffffffffff68);
            active_layers.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
          }
          else {
            fprintf(_stderr,"Fossilize ERROR: Cannot find VK_LAYER_KHRONOS_validation layer.\n");
            fflush(_stderr);
            this_local._7_1_ = 0;
            active_layers.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
          }
        }
        else {
          this_local._7_1_ = 0;
          active_layers.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
        }
        std::vector<VkLayerProperties,_std::allocator<VkLayerProperties>_>::~vector
                  ((vector<VkLayerProperties,_std::allocator<VkLayerProperties>_> *)local_88);
        if ((int)active_layers.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage == 0) goto LAB_001dafbc;
      }
      else {
        this_local._7_1_ = 0;
        active_layers.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
      }
    }
    std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_68);
  }
  else {
    pVVar17 = std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>::data
                        ((vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> *)
                         local_48);
    VVar13 = (*p_Var6)((char *)0x0,
                       (uint32_t *)
                       ((long)&exts.
                               super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),pVVar17);
    if (VVar13 == VK_SUCCESS) goto LAB_001dae77;
    this_local._7_1_ = 0;
    active_layers.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
  }
  std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>::~vector
            ((vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> *)local_48);
LAB_001dc7aa:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool VulkanDevice::init_device(const Options &opts)
{
	if (opts.null_device)
	{
		init_null_device();
		return true;
	}

	if (volkInitialize() != VK_SUCCESS)
	{
		LOGE("volkInitialize failed.\n");
		return false;
	}

	uint32_t instance_api_version = major_minor_version(volkGetInstanceVersion());
	if (instance_api_version == 0)
	{
		LOGE("Could not find loader.\n");
		return false;
	}

	uint32_t target_api_version = opts.application_info ? opts.application_info->apiVersion : instance_api_version;
	target_api_version = major_minor_version(target_api_version);

	if (target_api_version > instance_api_version)
	{
		LOGE("Database is targeting an API version which is unsupported by this Vulkan loader.\n");
		return false;
	}

	// Enable all extensions (FIXME: this is likely a problem).
	uint32_t ext_count = 0;
	if (vkEnumerateInstanceExtensionProperties(nullptr, &ext_count, nullptr) != VK_SUCCESS)
		return false;
	vector<VkExtensionProperties> exts(ext_count);
	if (ext_count && vkEnumerateInstanceExtensionProperties(nullptr, &ext_count, exts.data()) != VK_SUCCESS)
		return false;

	vector<const char *> active_layers;
	if (opts.enable_validation)
	{
		uint32_t layer_count = 0;
		if (vkEnumerateInstanceLayerProperties(&layer_count, nullptr) != VK_SUCCESS)
			return false;
		vector<VkLayerProperties> layers(layer_count);
		if (vkEnumerateInstanceLayerProperties(&layer_count, layers.data()) != VK_SUCCESS)
			return false;

		if (find_layer(layers, "VK_LAYER_KHRONOS_validation"))
			active_layers.push_back("VK_LAYER_KHRONOS_validation");
		else
		{
			LOGE("Cannot find VK_LAYER_KHRONOS_validation layer.\n");
			return false;
		}
	}

	bool use_debug_callback = find_extension(exts, VK_EXT_DEBUG_REPORT_EXTENSION_NAME);

	VkInstanceCreateInfo instance_info = { VK_STRUCTURE_TYPE_INSTANCE_CREATE_INFO };
	VkApplicationInfo app = { VK_STRUCTURE_TYPE_APPLICATION_INFO };
	app.apiVersion = instance_api_version;
	app.pApplicationName = "Fossilize Replayer";
	app.pEngineName = "Fossilize";

	instance_info.enabledLayerCount = uint32_t(active_layers.size());
	instance_info.ppEnabledLayerNames = active_layers.empty() ? nullptr : active_layers.data();
	instance_info.pApplicationInfo = opts.application_info ? opts.application_info : &app;

	for (uint32_t i = 0; i < instance_info.enabledLayerCount; i++)
		LOGI("Enabling instance layer: %s\n", instance_info.ppEnabledLayerNames[i]);
	for (uint32_t i = 0; i < instance_info.enabledExtensionCount; i++)
		LOGI("Enabling instance extension: %s\n", instance_info.ppEnabledExtensionNames[i]);

	vector<const char *> active_exts;
	for (auto &ext : exts)
		if (filter_instance_extension(ext.extensionName, instance_info.pApplicationInfo->apiVersion))
			active_exts.push_back(ext.extensionName);

	instance_info.enabledExtensionCount = uint32_t(active_exts.size());
	instance_info.ppEnabledExtensionNames = active_exts.empty() ? nullptr : active_exts.data();

	if (vkCreateInstance(&instance_info, nullptr, &instance) != VK_SUCCESS)
	{
		LOGE("Failed to create instance.\n");
		return false;
	}

	volkLoadInstance(instance);

	if (use_debug_callback)
	{
		VkDebugReportCallbackCreateInfoEXT cb_info = { VK_STRUCTURE_TYPE_DEBUG_REPORT_CALLBACK_CREATE_INFO_EXT };
		cb_info.pfnCallback = debug_callback;
		cb_info.flags = VK_DEBUG_REPORT_ERROR_BIT_EXT;
		cb_info.pUserData = this;

		if (vkCreateDebugReportCallbackEXT(instance, &cb_info, nullptr, &callback) != VK_SUCCESS)
			return false;
	}

	uint32_t gpu_count = 0;
	if (vkEnumeratePhysicalDevices(instance, &gpu_count, nullptr) != VK_SUCCESS)
		return false;
	vector<VkPhysicalDevice> gpus(gpu_count);

	if (!gpu_count)
	{
		LOGE("No physical devices.\n");
		return false;
	}

	if (vkEnumeratePhysicalDevices(instance, &gpu_count, gpus.data()) != VK_SUCCESS)
		return false;

	for (uint32_t i = 0; i < gpu_count; i++)
	{
		vkGetPhysicalDeviceProperties(gpus[i], &gpu_props);
		LOGI("Enumerated GPU #%u:\n", i);
		LOGI("  name: %s\n", gpu_props.deviceName);
		LOGI("  apiVersion: %u.%u.%u\n",
		     VK_VERSION_MAJOR(gpu_props.apiVersion),
		     VK_VERSION_MINOR(gpu_props.apiVersion),
		     VK_VERSION_PATCH(gpu_props.apiVersion));
	}

	if (opts.device_index >= 0)
	{
		if (size_t(opts.device_index) >= gpus.size())
		{
			LOGE("Device index %d is out of range, only %u devices on system.\n",
			     opts.device_index, unsigned(gpus.size()));
			return false;
		}
		gpu = gpus[opts.device_index];
	}
	else
		gpu = gpus.front();

	vkGetPhysicalDeviceProperties(gpu, &gpu_props);
	LOGI("Chose GPU:\n");
	LOGI("  name: %s\n", gpu_props.deviceName);
	LOGI("  apiVersion: %u.%u.%u\n",
	     VK_VERSION_MAJOR(gpu_props.apiVersion),
	     VK_VERSION_MINOR(gpu_props.apiVersion),
	     VK_VERSION_PATCH(gpu_props.apiVersion));
	LOGI("  vendorID: 0x%x\n", gpu_props.vendorID);
	LOGI("  deviceID: 0x%x\n", gpu_props.deviceID);

	uint32_t gpu_api_version = major_minor_version(gpu_props.apiVersion);
	if (!opts.application_info)
		target_api_version = instance_api_version < gpu_api_version ? instance_api_version : gpu_api_version;

	if (target_api_version > gpu_api_version)
	{
		LOGE("Selected GPU does not support desired Vulkan API version.\n");
		return false;
	}

	api_version = target_api_version;

	vector<const char *> active_device_extensions;
	uint32_t device_ext_count = 0;
	if (vkEnumerateDeviceExtensionProperties(gpu, nullptr, &device_ext_count, nullptr) != VK_SUCCESS)
		return false;
	vector<VkExtensionProperties> device_ext_props(device_ext_count);
	if (device_ext_count && vkEnumerateDeviceExtensionProperties(gpu, nullptr, &device_ext_count, device_ext_props.data()) != VK_SUCCESS)
		return false;

	for (auto &ext : device_ext_props)
		if (filter_extension(ext.extensionName, opts.want_amd_shader_info, device_ext_props, api_version))
			active_device_extensions.push_back(ext.extensionName);

	bool has_device_features2 = find_extension(exts, VK_KHR_GET_PHYSICAL_DEVICE_PROPERTIES_2_EXTENSION_NAME);

	VkPhysicalDeviceFeatures2 gpu_features2 = { VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FEATURES_2 };
	VkPhysicalDevicePipelineExecutablePropertiesFeaturesKHR stats_feature = {
		VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_PIPELINE_EXECUTABLE_PROPERTIES_FEATURES_KHR
	};
	gpu_features2.pNext = &stats_feature;
	if (has_device_features2)
	{
		stats_feature.pNext = build_pnext_chain(features, api_version,
		                                        active_device_extensions.data(),
		                                        uint32_t(active_device_extensions.size()));
		vkGetPhysicalDeviceFeatures2KHR(gpu, &gpu_features2);

		pipeline_stats = stats_feature.pipelineExecutableInfo;
		if (pipeline_stats && opts.want_pipeline_stats)
			stats_feature.pipelineExecutableInfo = VK_TRUE;
		else
			stats_feature.pipelineExecutableInfo = VK_FALSE;
	}
	else
		vkGetPhysicalDeviceFeatures(gpu, &gpu_features2.features);

	VkPhysicalDeviceProperties2 gpu_props2 = { VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_PROPERTIES_2 };
	if (has_device_features2)
	{
		gpu_props2.pNext = build_pnext_chain(props, api_version,
		                                     active_device_extensions.data(),
		                                     uint32_t(active_device_extensions.size()));
		vkGetPhysicalDeviceProperties2KHR(gpu, &gpu_props2);
	}
	else
		vkGetPhysicalDeviceProperties(gpu, &gpu_props2.properties);

	// A fairly ugly, but important workaround.
	// When replaying dxvk/vkd3d, we expect robustness2, but this was not captured on earlier databases,
	// which means we get different shader hashes when replaying.
	// For now, it's pragmatic to just enable robustness2 until old Fossils have been retired.
	// New fossils will capture robustness2.
	const auto *requested_pdf2 = opts.features;
	VkPhysicalDeviceFeatures2 replacement_pdf2;
	VkPhysicalDeviceRobustness2FeaturesEXT replacement_robustness2;
	VkPhysicalDeviceFragmentShadingRateFeaturesKHR replacement_fragment_shading_rate;

	const auto begin_replacement = [&](void *pnext) {
		if (&replacement_pdf2 != requested_pdf2)
		{
			replacement_pdf2 = *requested_pdf2;
			requested_pdf2 = &replacement_pdf2;
		}

		static_cast<VkBaseOutStructure *>(pnext)->pNext =
				static_cast<VkBaseOutStructure *>(replacement_pdf2.pNext);
		replacement_pdf2.pNext = pnext;
	};

	if (opts.features)
	{
		if (application_info_promote_robustness2(opts.application_info) &&
		    find_pnext<VkPhysicalDeviceRobustness2FeaturesEXT>(
				    VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_ROBUSTNESS_2_FEATURES_EXT,
				    opts.features->pNext) == nullptr)
		{
			replacement_robustness2 = { VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_ROBUSTNESS_2_FEATURES_EXT };
			begin_replacement(&replacement_robustness2);

			replacement_robustness2.robustBufferAccess2 = opts.features->features.robustBufferAccess;
			replacement_robustness2.robustImageAccess2 = opts.features->features.robustBufferAccess;
			replacement_robustness2.nullDescriptor = VK_TRUE;
		}

		if (application_info_promote_fragment_shading_rate(opts.application_info) &&
		    find_pnext<VkPhysicalDeviceFragmentShadingRateFeaturesKHR>(
				    VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FRAGMENT_SHADING_RATE_FEATURES_KHR,
				    opts.features->pNext) == nullptr)
		{
			replacement_fragment_shading_rate = { VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FRAGMENT_SHADING_RATE_FEATURES_KHR };
			begin_replacement(&replacement_fragment_shading_rate);
			reset_features(replacement_fragment_shading_rate, VK_TRUE);
		}
	}

	size_t active_extension_count = active_device_extensions.size();
	filter_feature_enablement(gpu_features2, features, requested_pdf2,
	                          active_device_extensions.data(), &active_extension_count);
	active_device_extensions.resize(active_extension_count);

	// Just pick one graphics queue.
	// FIXME: Does shader compilation depend on which queues we have enabled?
	// FIXME: Potentially separate code-gen if COMPUTE queue needs different optimizations, etc ...
	uint32_t family_count = 0;
	vkGetPhysicalDeviceQueueFamilyProperties(gpu, &family_count, nullptr);
	vector<VkQueueFamilyProperties> queue_props(family_count);
	vkGetPhysicalDeviceQueueFamilyProperties(gpu, &family_count, queue_props.data());

	VkDeviceQueueCreateInfo queue_info = { VK_STRUCTURE_TYPE_DEVICE_QUEUE_CREATE_INFO };
	static float one = 1.0f;
	queue_info.pQueuePriorities = &one;
	queue_info.queueCount = 1;
	for (auto &queue_prop : queue_props)
	{
		if ((queue_prop.queueCount > 0) && (queue_prop.queueFlags & VK_QUEUE_GRAPHICS_BIT))
		{
			queue_info.queueFamilyIndex = uint32_t(&queue_prop - queue_props.data());
			break;
		}
	}

	vector<const char *> active_device_layers;
	if (opts.enable_validation)
	{
		uint32_t device_layer_count = 0;
		if (vkEnumerateDeviceLayerProperties(gpu, &device_layer_count, nullptr) != VK_SUCCESS)
			return false;
		vector<VkLayerProperties> device_layers(device_layer_count);
		if (device_layer_count && vkEnumerateDeviceLayerProperties(gpu, &device_layer_count, device_layers.data()) != VK_SUCCESS)
			return false;

		if (find_layer(device_layers, "VK_LAYER_KHRONOS_validation"))
		{
			active_device_layers.push_back("VK_LAYER_KHRONOS_validation");

			uint32_t validation_ext_count = 0;
			vkEnumerateDeviceExtensionProperties(gpu, "VK_LAYER_KHRONOS_validation", &validation_ext_count, nullptr);
			vector<VkExtensionProperties> validation_extensions(validation_ext_count);
			vkEnumerateDeviceExtensionProperties(gpu, "VK_LAYER_KHRONOS_validation", &validation_ext_count, validation_extensions.data());
			validation_cache = find_extension(validation_extensions, VK_EXT_VALIDATION_CACHE_EXTENSION_NAME);
			if (validation_cache)
				active_device_extensions.push_back(VK_EXT_VALIDATION_CACHE_EXTENSION_NAME);
		}
		else
		{
			LOGE("Cannot find VK_LAYER_KHRONOS_validation layer.\n");
			return false;
		}
	}

	supports_pipeline_feedback = find_if(begin(active_device_extensions), end(active_device_extensions), [](const char *ext) {
		return strcmp(ext, VK_EXT_PIPELINE_CREATION_FEEDBACK_EXTENSION_NAME) == 0;
	}) != end(active_device_extensions);

	amd_shader_info = find_if(begin(active_device_extensions), end(active_device_extensions), [](const char *ext) {
		return strcmp(ext, VK_AMD_SHADER_INFO_EXTENSION_NAME) == 0;
	}) != end(active_device_extensions);

	supports_module_identifiers = features.shader_module_identifier.shaderModuleIdentifier == VK_TRUE;

	VkDeviceCreateInfo device_info = { VK_STRUCTURE_TYPE_DEVICE_CREATE_INFO };
	device_info.pNext = has_device_features2 ? &gpu_features2 : nullptr;
	device_info.pEnabledFeatures = has_device_features2 ? nullptr : &gpu_features2.features;
	device_info.pQueueCreateInfos = &queue_info;
	device_info.queueCreateInfoCount = 1;
	device_info.enabledLayerCount = uint32_t(active_device_layers.size());
	device_info.ppEnabledLayerNames = active_device_layers.empty() ? nullptr : active_device_layers.data();
	device_info.enabledExtensionCount = uint32_t(active_device_extensions.size());
	device_info.ppEnabledExtensionNames = active_device_extensions.empty() ? nullptr : active_device_extensions.data();

	if (device_info.ppEnabledLayerNames)
		for (uint32_t i = 0; i < device_info.enabledLayerCount; i++)
			LOGI("Enabling device layer: %s\n", device_info.ppEnabledLayerNames[i]);

	if (device_info.ppEnabledExtensionNames)
		for (uint32_t i = 0; i < device_info.enabledExtensionCount; i++)
			LOGI("Enabling device extension: %s\n", device_info.ppEnabledExtensionNames[i]);

	if (vkCreateDevice(gpu, &device_info, nullptr, &device) != VK_SUCCESS)
	{
		LOGE("Failed to create device.\n");
		return false;
	}

	if (!feature_filter.init(api_version, active_device_extensions.data(), active_device_extensions.size(),
	                         &gpu_features2, &gpu_props2))
	{
		LOGE("Failed to init feature filter.\n");
		return false;
	}

	feature_filter.set_device_query_interface(this);

	return true;
}